

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldebug.c
# Opt level: O1

void luaG_runerror(lua_State *L,char *fmt,...)

{
  CallInfo *pCVar1;
  long lVar2;
  char in_AL;
  char *msg;
  int line;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list argp;
  __va_list_tag local_e8;
  undefined1 local_c8 [16];
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_28;
  
  if (in_AL != '\0') {
    local_98 = in_XMM0_Qa;
    local_88 = in_XMM1_Qa;
    local_78 = in_XMM2_Qa;
    local_68 = in_XMM3_Qa;
    local_58 = in_XMM4_Qa;
    local_48 = in_XMM5_Qa;
    local_38 = in_XMM6_Qa;
    local_28 = in_XMM7_Qa;
  }
  pCVar1 = L->ci;
  local_b8 = in_RDX;
  local_b0 = in_RCX;
  local_a8 = in_R8;
  local_a0 = in_R9;
  if (0 < L->l_G->GCdebt) {
    luaC_step(L);
  }
  local_e8.reg_save_area = local_c8;
  local_e8.overflow_arg_area = &argp[0].overflow_arg_area;
  local_e8.gp_offset = 0x10;
  local_e8.fp_offset = 0x30;
  msg = luaO_pushvfstring(L,fmt,&local_e8);
  if ((pCVar1->callstatus & 2) != 0) {
    lVar2 = *(long *)((pCVar1->func->value_).f + 0x18);
    line = -1;
    if (*(long *)(lVar2 + 0x48) != 0) {
      line = *(int *)(*(long *)(lVar2 + 0x48) +
                     (((long)(pCVar1->u).l.savedpc - *(long *)(lVar2 + 0x38)) * 0x40000000 +
                      -0x100000000 >> 0x20) * 4);
    }
    luaG_addinfo(L,msg,*(TString **)(lVar2 + 0x68),line);
  }
  luaG_errormsg(L);
}

Assistant:

l_noret luaG_runerror (lua_State *L, const char *fmt, ...) {
  CallInfo *ci = L->ci;
  const char *msg;
  va_list argp;
  luaC_checkGC(L);  /* error message uses memory */
  va_start(argp, fmt);
  msg = luaO_pushvfstring(L, fmt, argp);  /* format message */
  va_end(argp);
  if (isLua(ci))  /* if Lua function, add source:line information */
    luaG_addinfo(L, msg, ci_func(ci)->p->source, currentline(ci));
  luaG_errormsg(L);
}